

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool copy_accessed_types(DatabaseInterface *input_db,DatabaseInterface *output_db,
                        vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json,
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *accessed,ResourceTag tag,uint *per_tag_written)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  uchar *puVar6;
  size_type sVar7;
  size_type local_68;
  size_t compressed_size;
  value_type hash;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1;
  uint *per_tag_written_local;
  ResourceTag tag_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *accessed_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json_local;
  DatabaseInterface *output_db_local;
  DatabaseInterface *input_db_local;
  
  sVar4 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::size(accessed);
  per_tag_written[tag] = (uint)sVar4;
  __end1 = std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin(accessed);
  hash = (value_type)
         std::
         unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         ::end(accessed);
  do {
    bVar2 = std::__detail::operator!=
                      (&__end1.super__Node_iterator_base<unsigned_long,_false>,
                       (_Node_iterator_base<unsigned_long,_false> *)&hash);
    if (!bVar2) {
      return true;
    }
    pvVar5 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end1);
    compressed_size = *pvVar5;
    local_68 = 0;
    uVar3 = (*input_db->_vptr_DatabaseInterface[3])
                      (input_db,(ulong)tag,compressed_size,&local_68,0,1);
    if ((uVar3 & 1) == 0) {
      if (tag != RESOURCE_SHADER_MODULE) {
        return false;
      }
      fprintf(_stderr,
              "Fossilize ERROR: Reference shader module %016lx does not exist in database.\n",
              compressed_size);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(state_json,local_68);
      sVar1 = compressed_size;
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(state_json);
      uVar3 = (*input_db->_vptr_DatabaseInterface[3])(input_db,(ulong)tag,sVar1,&local_68,puVar6,1);
      sVar1 = compressed_size;
      if ((uVar3 & 1) == 0) {
        return false;
      }
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(state_json);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(state_json);
      uVar3 = (*output_db->_vptr_DatabaseInterface[4])(output_db,(ulong)tag,sVar1,puVar6,sVar7,1);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end1);
  } while( true );
}

Assistant:

static bool copy_accessed_types(DatabaseInterface &input_db,
                                DatabaseInterface &output_db,
                                vector<uint8_t> &state_json,
                                const unordered_set<Hash> &accessed,
                                ResourceTag tag,
                                unsigned *per_tag_written)
{
	per_tag_written[tag] = accessed.size();
	for (auto hash : accessed)
	{
		size_t compressed_size = 0;
		if (!input_db.read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
		{
			if (tag == RESOURCE_SHADER_MODULE)
			{
				// We did not resolve shader module references, so we might hit an error here, but that's fine.
				LOGE("Reference shader module %016" PRIx64 " does not exist in database.\n", hash);
				continue;
			}
			else
				return false;
		}

		state_json.resize(compressed_size);

		if (!input_db.read_entry(tag, hash, &compressed_size, state_json.data(), PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
			return false;
		if (!output_db.write_entry(tag, hash, state_json.data(), state_json.size(), PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
			return false;
	}
	return true;
}